

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnRelocCount
          (BinaryReaderObjdump *this,Index count,Index section_index)

{
  string_view sVar1;
  
  BinaryReaderObjdumpBase::OnRelocCount(&this->super_BinaryReaderObjdumpBase,count,section_index);
  sVar1 = ObjdumpNames::Get(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->section_names,
                            section_index);
  PrintDetails(this,"  - relocations for section: %d (%.*s) [%d]\n",(ulong)section_index,
               (ulong)(uint)sVar1._M_len,sVar1._M_str,count);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnRelocCount(Index count, Index section_index) {
  BinaryReaderObjdumpBase::OnRelocCount(count, section_index);
  PrintDetails("  - relocations for section: %d (" PRIstringview ") [%d]\n",
               section_index,
               WABT_PRINTF_STRING_VIEW_ARG(GetSectionName(section_index)),
               count);
  return Result::Ok;
}